

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleResource.cpp
# Opt level: O1

bool __thiscall SampleResource::load(SampleResource *this)

{
  char cVar1;
  ALLEGRO_SAMPLE *pAVar2;
  bool bVar3;
  
  cVar1 = al_is_audio_installed();
  if (cVar1 == '\0') {
    debug_message("Skipped loading sample %s\n");
    bVar3 = true;
  }
  else {
    pAVar2 = (ALLEGRO_SAMPLE *)al_load_sample((this->filename)._M_dataplus._M_p);
    this->sample_data = pAVar2;
    bVar3 = true;
    if (pAVar2 == (ALLEGRO_SAMPLE *)0x0) {
      bVar3 = false;
      debug_message("Error loading sample %s\n",(this->filename)._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

bool SampleResource::load(void)
{
   if (!al_is_audio_installed()) {
      debug_message("Skipped loading sample %s\n", filename.c_str());
      return true;
   }

   sample_data = al_load_sample(filename.c_str());
   if (!sample_data) {
      debug_message("Error loading sample %s\n", filename.c_str());
      return false;
   }

   return true;
}